

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ram_list_entities_for_policy.cc
# Opt level: O3

int __thiscall
aliyun::Ram::ListEntitiesForPolicy
          (Ram *this,RamListEntitiesForPolicyRequestType *req,
          RamListEntitiesForPolicyResponseType *response,RamErrorInfo *error_info)

{
  iterator *piVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  ArrayIndex AVar5;
  char *pcVar6;
  AliRpcRequest *this_00;
  long *plVar7;
  size_t sVar8;
  Value *pVVar9;
  Value *pVVar10;
  size_type *psVar11;
  uint uVar12;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  string local_410;
  Value *local_3f0;
  Value local_3e8;
  RamListEntitiesForPolicyResponseType *local_3d0;
  undefined1 local_3c8 [32];
  _Alloc_hider local_3a8;
  size_type local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  _Alloc_hider local_388;
  size_type local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  _Alloc_hider local_368;
  size_type local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  _Alloc_hider local_348;
  size_type local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  long *local_328;
  long local_320;
  long local_318 [2];
  string local_308;
  vector<aliyun::RamListEntitiesForPolicyUserType,_std::allocator<aliyun::RamListEntitiesForPolicyUserType>_>
  *local_2e8;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  local_308._M_string_length = 0;
  local_308.field_2._M_local_buf[0] = '\0';
  pcVar6 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar6 = "https";
  }
  local_328 = local_318;
  local_3d0 = response;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_328,pcVar6,pcVar6 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)local_3c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_3e8);
  piVar1 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_328,local_320 + (long)local_328);
  std::__cxx11::string::append((char *)&local_140);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_2e0.field_2._M_allocated_capacity = *psVar11;
    local_2e0.field_2._8_8_ = plVar7[3];
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  }
  else {
    local_2e0.field_2._M_allocated_capacity = *psVar11;
    local_2e0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2e0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_2e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar1) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar6 = this->proxy_host_, pcVar6 != (char *)0x0)) &&
     (*pcVar6 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar8 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar6,pcVar6 + sVar8);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_3e8,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"ListEntitiesForPolicy","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->policy_type)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"PolicyType","");
    pcVar2 = (req->policy_type)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar2,pcVar2 + (req->policy_type)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->policy_name)._M_string_length != 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"PolicyName","");
    pcVar2 = (req->policy_name)._M_dataplus._M_p;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar2,pcVar2 + (req->policy_name)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_3c8);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar4 == 0) {
    iVar4 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_308);
    if (((0 < iVar4) && (local_308._M_string_length != 0)) &&
       (bVar3 = Json::Reader::parse(&local_140,&local_308,&local_3e8,true), bVar3)) {
      if (error_info != (RamErrorInfo *)0x0 && iVar4 != 200) {
        bVar3 = Json::Value::isMember(&local_3e8,"RequestId");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_3e8,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_3c8,pVVar9);
        }
        else {
          local_3c8._0_8_ = local_3c8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3c8,anon_var_dwarf_3083ba + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_3c8);
        pcVar2 = local_3c8 + 0x10;
        if ((pointer)local_3c8._0_8_ != pcVar2) {
          operator_delete((void *)local_3c8._0_8_,CONCAT71(local_3c8._17_7_,local_3c8[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_3e8,"Code");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_3e8,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_3c8,pVVar9);
        }
        else {
          local_3c8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3c8,anon_var_dwarf_3083ba + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_3c8);
        if ((pointer)local_3c8._0_8_ != pcVar2) {
          operator_delete((void *)local_3c8._0_8_,CONCAT71(local_3c8._17_7_,local_3c8[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_3e8,"HostId");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_3e8,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_3c8,pVVar9);
        }
        else {
          local_3c8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3c8,anon_var_dwarf_3083ba + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_3c8);
        if ((pointer)local_3c8._0_8_ != pcVar2) {
          operator_delete((void *)local_3c8._0_8_,CONCAT71(local_3c8._17_7_,local_3c8[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_3e8,"Message");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_3e8,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_3c8,pVVar9);
        }
        else {
          local_3c8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3c8,anon_var_dwarf_3083ba + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_3c8);
        if ((pointer)local_3c8._0_8_ != pcVar2) {
          operator_delete((void *)local_3c8._0_8_,CONCAT71(local_3c8._17_7_,local_3c8[0x10]) + 1);
        }
      }
      if (local_3d0 != (RamListEntitiesForPolicyResponseType *)0x0 && iVar4 == 200) {
        bVar3 = Json::Value::isMember(&local_3e8,"Groups");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_3e8,"Groups");
          bVar3 = Json::Value::isMember(pVVar9,"Group");
          if (bVar3) {
            pVVar9 = Json::Value::operator[](&local_3e8,"Groups");
            pVVar9 = Json::Value::operator[](pVVar9,"Group");
            bVar3 = Json::Value::isArray(pVVar9);
            local_3f0 = pVVar9;
            if ((bVar3) && (AVar5 = Json::Value::size(pVVar9), AVar5 != 0)) {
              uVar12 = 0;
              do {
                local_3c8._8_8_ = 0;
                local_3c8[0x10] = '\0';
                local_3a0 = 0;
                local_398._M_local_buf[0] = '\0';
                local_388._M_p = (pointer)&local_378;
                local_380 = 0;
                local_378._M_local_buf[0] = '\0';
                local_3c8._0_8_ = local_3c8 + 0x10;
                local_3a8._M_p = (pointer)&local_398;
                pVVar9 = Json::Value::operator[](local_3f0,uVar12);
                bVar3 = Json::Value::isMember(pVVar9,"GroupName");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"GroupName");
                  Json::Value::asString_abi_cxx11_(&local_410,pVVar10);
                  std::__cxx11::string::operator=((string *)local_3c8,(string *)&local_410);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_410._M_dataplus._M_p != &local_410.field_2) {
                    operator_delete(local_410._M_dataplus._M_p,
                                    local_410.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar9,"Comments");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"Comments");
                  Json::Value::asString_abi_cxx11_(&local_410,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_3a8,(string *)&local_410);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_410._M_dataplus._M_p != &local_410.field_2) {
                    operator_delete(local_410._M_dataplus._M_p,
                                    local_410.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar9,"AttachDate");
                if (bVar3) {
                  pVVar9 = Json::Value::operator[](pVVar9,"AttachDate");
                  Json::Value::asString_abi_cxx11_(&local_410,pVVar9);
                  std::__cxx11::string::operator=((string *)&local_388,(string *)&local_410);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_410._M_dataplus._M_p != &local_410.field_2) {
                    operator_delete(local_410._M_dataplus._M_p,
                                    local_410.field_2._M_allocated_capacity + 1);
                  }
                }
                std::
                vector<aliyun::RamListEntitiesForPolicyGroupType,_std::allocator<aliyun::RamListEntitiesForPolicyGroupType>_>
                ::push_back(&local_3d0->groups,(value_type *)local_3c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_388._M_p != &local_378) {
                  operator_delete(local_388._M_p,
                                  CONCAT71(local_378._M_allocated_capacity._1_7_,
                                           local_378._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a8._M_p != &local_398) {
                  operator_delete(local_3a8._M_p,
                                  CONCAT71(local_398._M_allocated_capacity._1_7_,
                                           local_398._M_local_buf[0]) + 1);
                }
                if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
                  operator_delete((void *)local_3c8._0_8_,
                                  CONCAT71(local_3c8._17_7_,local_3c8[0x10]) + 1);
                }
                AVar5 = Json::Value::size(local_3f0);
                uVar12 = uVar12 + 1;
              } while (uVar12 < AVar5);
            }
          }
        }
        bVar3 = Json::Value::isMember(&local_3e8,"Users");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_3e8,"Users");
          bVar3 = Json::Value::isMember(pVVar9,"User");
          if (bVar3) {
            pVVar9 = Json::Value::operator[](&local_3e8,"Users");
            pVVar9 = Json::Value::operator[](pVVar9,"User");
            bVar3 = Json::Value::isArray(pVVar9);
            local_3f0 = pVVar9;
            if ((bVar3) && (AVar5 = Json::Value::size(pVVar9), AVar5 != 0)) {
              local_2e8 = &local_3d0->users;
              uVar12 = 0;
              do {
                local_3c8._8_8_ = 0;
                local_3c8[0x10] = '\0';
                local_3a8._M_p = (pointer)&local_398;
                local_3a0 = 0;
                local_398._M_local_buf[0] = '\0';
                local_388._M_p = (pointer)&local_378;
                local_380 = 0;
                local_378._M_local_buf[0] = '\0';
                local_368._M_p = (pointer)&local_358;
                local_360 = 0;
                local_358._M_local_buf[0] = '\0';
                local_3c8._0_8_ = local_3c8 + 0x10;
                pVVar9 = Json::Value::operator[](local_3f0,uVar12);
                bVar3 = Json::Value::isMember(pVVar9,"UserId");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"UserId");
                  Json::Value::asString_abi_cxx11_(&local_410,pVVar10);
                  std::__cxx11::string::operator=((string *)local_3c8,(string *)&local_410);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_410._M_dataplus._M_p != &local_410.field_2) {
                    operator_delete(local_410._M_dataplus._M_p,
                                    local_410.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar9,"UserName");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"UserName");
                  Json::Value::asString_abi_cxx11_(&local_410,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_3a8,(string *)&local_410);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_410._M_dataplus._M_p != &local_410.field_2) {
                    operator_delete(local_410._M_dataplus._M_p,
                                    local_410.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar9,"DisplayName");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"DisplayName");
                  Json::Value::asString_abi_cxx11_(&local_410,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_388,(string *)&local_410);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_410._M_dataplus._M_p != &local_410.field_2) {
                    operator_delete(local_410._M_dataplus._M_p,
                                    local_410.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar9,"AttachDate");
                if (bVar3) {
                  pVVar9 = Json::Value::operator[](pVVar9,"AttachDate");
                  Json::Value::asString_abi_cxx11_(&local_410,pVVar9);
                  std::__cxx11::string::operator=((string *)&local_368,(string *)&local_410);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_410._M_dataplus._M_p != &local_410.field_2) {
                    operator_delete(local_410._M_dataplus._M_p,
                                    local_410.field_2._M_allocated_capacity + 1);
                  }
                }
                std::
                vector<aliyun::RamListEntitiesForPolicyUserType,_std::allocator<aliyun::RamListEntitiesForPolicyUserType>_>
                ::push_back(local_2e8,(value_type *)local_3c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368._M_p != &local_358) {
                  operator_delete(local_368._M_p,
                                  CONCAT71(local_358._M_allocated_capacity._1_7_,
                                           local_358._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_388._M_p != &local_378) {
                  operator_delete(local_388._M_p,
                                  CONCAT71(local_378._M_allocated_capacity._1_7_,
                                           local_378._M_local_buf[0]) + 1);
                }
                pVVar9 = local_3f0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a8._M_p != &local_398) {
                  operator_delete(local_3a8._M_p,
                                  CONCAT71(local_398._M_allocated_capacity._1_7_,
                                           local_398._M_local_buf[0]) + 1);
                }
                if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
                  operator_delete((void *)local_3c8._0_8_,
                                  CONCAT71(local_3c8._17_7_,local_3c8[0x10]) + 1);
                }
                AVar5 = Json::Value::size(pVVar9);
                uVar12 = uVar12 + 1;
              } while (uVar12 < AVar5);
            }
          }
        }
        bVar3 = Json::Value::isMember(&local_3e8,"Roles");
        iVar4 = 200;
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_3e8,"Roles");
          bVar3 = Json::Value::isMember(pVVar9,"Role");
          if (bVar3) {
            pVVar9 = Json::Value::operator[](&local_3e8,"Roles");
            pVVar9 = Json::Value::operator[](pVVar9,"Role");
            bVar3 = Json::Value::isArray(pVVar9);
            if ((bVar3) && (AVar5 = Json::Value::size(pVVar9), AVar5 != 0)) {
              local_3d0 = (RamListEntitiesForPolicyResponseType *)&local_3d0->roles;
              uVar12 = 0;
              local_3f0 = pVVar9;
              do {
                local_3c8._8_8_ = 0;
                local_3c8[0x10] = '\0';
                local_3a8._M_p = (pointer)&local_398;
                local_3a0 = 0;
                local_398._M_local_buf[0] = '\0';
                local_388._M_p = (pointer)&local_378;
                local_380 = 0;
                local_378._M_local_buf[0] = '\0';
                local_368._M_p = (pointer)&local_358;
                local_360 = 0;
                local_358._M_local_buf[0] = '\0';
                local_348._M_p = (pointer)&local_338;
                local_340 = 0;
                local_338._M_local_buf[0] = '\0';
                local_3c8._0_8_ = local_3c8 + 0x10;
                pVVar9 = Json::Value::operator[](local_3f0,uVar12);
                bVar3 = Json::Value::isMember(pVVar9,"RoleId");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"RoleId");
                  Json::Value::asString_abi_cxx11_(&local_410,pVVar10);
                  std::__cxx11::string::operator=((string *)local_3c8,(string *)&local_410);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_410._M_dataplus._M_p != &local_410.field_2) {
                    operator_delete(local_410._M_dataplus._M_p,
                                    local_410.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar9,"RoleName");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"RoleName");
                  Json::Value::asString_abi_cxx11_(&local_410,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_3a8,(string *)&local_410);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_410._M_dataplus._M_p != &local_410.field_2) {
                    operator_delete(local_410._M_dataplus._M_p,
                                    local_410.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar9,"Arn");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"Arn");
                  Json::Value::asString_abi_cxx11_(&local_410,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_388,(string *)&local_410);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_410._M_dataplus._M_p != &local_410.field_2) {
                    operator_delete(local_410._M_dataplus._M_p,
                                    local_410.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar9,"Description");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"Description");
                  Json::Value::asString_abi_cxx11_(&local_410,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_368,(string *)&local_410);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_410._M_dataplus._M_p != &local_410.field_2) {
                    operator_delete(local_410._M_dataplus._M_p,
                                    local_410.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar9,"AttachDate");
                if (bVar3) {
                  pVVar9 = Json::Value::operator[](pVVar9,"AttachDate");
                  Json::Value::asString_abi_cxx11_(&local_410,pVVar9);
                  std::__cxx11::string::operator=((string *)&local_348,(string *)&local_410);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_410._M_dataplus._M_p != &local_410.field_2) {
                    operator_delete(local_410._M_dataplus._M_p,
                                    local_410.field_2._M_allocated_capacity + 1);
                  }
                }
                std::
                vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
                ::push_back((vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
                             *)local_3d0,(value_type *)local_3c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_p != &local_338) {
                  operator_delete(local_348._M_p,
                                  CONCAT71(local_338._M_allocated_capacity._1_7_,
                                           local_338._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368._M_p != &local_358) {
                  operator_delete(local_368._M_p,
                                  CONCAT71(local_358._M_allocated_capacity._1_7_,
                                           local_358._M_local_buf[0]) + 1);
                }
                pVVar9 = local_3f0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_388._M_p != &local_378) {
                  operator_delete(local_388._M_p,
                                  CONCAT71(local_378._M_allocated_capacity._1_7_,
                                           local_378._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a8._M_p != &local_398) {
                  operator_delete(local_3a8._M_p,
                                  CONCAT71(local_398._M_allocated_capacity._1_7_,
                                           local_398._M_local_buf[0]) + 1);
                }
                if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
                  operator_delete((void *)local_3c8._0_8_,
                                  CONCAT71(local_3c8._17_7_,local_3c8[0x10]) + 1);
                }
                AVar5 = Json::Value::size(pVVar9);
                uVar12 = uVar12 + 1;
              } while (uVar12 < AVar5);
            }
          }
        }
      }
      goto LAB_00149dfc;
    }
    if (error_info == (RamErrorInfo *)0x0) goto LAB_00149df7;
    pcVar6 = "parse response failed";
  }
  else {
    if (error_info == (RamErrorInfo *)0x0) {
LAB_00149df7:
      iVar4 = -1;
      goto LAB_00149dfc;
    }
    pcVar6 = "connect to host failed";
  }
  iVar4 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar6);
LAB_00149dfc:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_3e8);
  if (local_328 != local_318) {
    operator_delete(local_328,local_318[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,
                    CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,
                             local_308.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int Ram::ListEntitiesForPolicy(const RamListEntitiesForPolicyRequestType& req,
                      RamListEntitiesForPolicyResponseType* response,
                       RamErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","ListEntitiesForPolicy");
  if(!req.policy_type.empty()) {
    req_rpc->AddRequestQuery("PolicyType", req.policy_type);
  }
  if(!req.policy_name.empty()) {
    req_rpc->AddRequestQuery("PolicyName", req.policy_name);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}